

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdAddPsbtGlobalXpubkey
              (void *handle,void *psbt_handle,char *xpubkey,char *fingerprint,char *bip32_path)

{
  pointer puVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pointer puVar4;
  bool bVar5;
  NetType NVar6;
  size_t sVar7;
  CfdException *pCVar8;
  string xpub_str;
  allocator local_3da;
  allocator local_3d9;
  undefined1 local_3d8 [32];
  pointer puStack_3b8;
  pointer local_3b0;
  pointer local_3a8;
  pointer local_3a0;
  pointer puStack_398;
  pointer local_390;
  pointer local_388;
  pointer puStack_380;
  pointer local_378;
  pointer puStack_370;
  pointer local_368;
  pointer local_360;
  pointer puStack_358;
  pointer local_350;
  bool local_348;
  undefined3 uStack_347;
  NetType NStack_344;
  pointer local_340;
  pointer puStack_338;
  pointer local_330;
  pointer local_328;
  pointer puStack_320;
  pointer local_318;
  uint32_t local_310;
  uint32_t uStack_30c;
  uint8_t uStack_308;
  undefined3 uStack_307;
  uint32_t uStack_304;
  pointer local_300;
  pointer puStack_2f8;
  pointer local_2f0;
  pointer local_2e8;
  pointer puStack_2e0;
  pointer local_2d8;
  pointer local_2d0;
  pointer puStack_2c8;
  pointer local_2c0;
  pointer local_2b8;
  pointer puStack_2b0;
  pointer local_2a8;
  pointer local_2a0;
  pointer puStack_298;
  pointer local_290;
  undefined1 local_288 [32];
  pointer puStack_268;
  pointer puStack_260;
  pointer local_258;
  pointer local_250;
  pointer puStack_248;
  pointer puStack_240;
  pointer local_238;
  pointer puStack_230;
  pointer local_228;
  pointer puStack_220;
  pointer puStack_218;
  pointer local_210;
  pointer puStack_208;
  pointer puStack_200;
  bool local_1f8;
  undefined3 uStack_1f7;
  NetType NStack_1f4;
  pointer local_1f0;
  pointer puStack_1e8;
  pointer puStack_1e0;
  pointer local_1d8;
  pointer puStack_1d0;
  pointer puStack_1c8;
  uint32_t local_1c0;
  uint32_t uStack_1bc;
  uint8_t uStack_1b8;
  undefined3 uStack_1b7;
  uint32_t uStack_1b4;
  pointer local_1b0;
  pointer puStack_1a8;
  pointer puStack_1a0;
  pointer local_198;
  pointer puStack_190;
  pointer puStack_188;
  pointer local_180;
  pointer puStack_178;
  pointer puStack_170;
  pointer local_168;
  pointer puStack_160;
  pointer puStack_158;
  pointer local_150;
  pointer puStack_148;
  pointer puStack_140;
  ByteData local_130;
  string local_118;
  string local_f8;
  string local_d8;
  ByteData local_b8;
  ExtPubkey local_a0;
  
  cfd::Initialize();
  pcVar2 = local_288 + 0x10;
  local_288._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_288);
  if ((pointer)local_288._0_8_ != pcVar2) {
    operator_delete((void *)local_288._0_8_);
  }
  bVar5 = cfd::capi::IsEmptyString(xpubkey);
  if (bVar5) {
    local_288._0_8_ = "cfdcapi_psbt.cpp";
    local_288._8_4_ = 0x83c;
    local_288._16_8_ = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_288,kCfdLogLevelWarning,"xpubkey is null or empty.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_288._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"Failed to parameter. xpubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_288);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    local_288._0_8_ = "cfdcapi_psbt.cpp";
    local_288._8_4_ = 0x842;
    local_288._16_8_ = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::log<>((CfdSourceLocation *)local_288,kCfdLogLevelWarning,"psbt is null.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_288._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)local_288);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_d8,xpubkey,(allocator *)local_288);
  cfd::core::KeyData::KeyData((KeyData *)local_288);
  if (local_d8._M_string_length == 0x9c) {
    cfd::core::ByteData::ByteData((ByteData *)&local_f8,&local_d8);
    cfd::core::ExtPubkey::ExtPubkey(&local_a0,(ByteData *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
    cfd::core::ByteData::ByteData(&local_130);
    cfd::core::KeyData::KeyData((KeyData *)local_3d8,&local_a0,&local_118,&local_130);
    uVar3 = local_288._0_8_;
    local_288._0_8_ = local_3d8._0_8_;
    local_288._8_8_ = local_3d8._8_8_;
    local_288._16_8_ = local_3d8._16_8_;
    local_3d8._0_8_ = (pointer)0x0;
    local_3d8._8_8_ = (pointer)0x0;
    local_3d8._16_8_ = (pointer)0x0;
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3);
    }
    uVar3 = local_288._24_8_;
    local_288._24_8_ = local_3d8._24_8_;
    puStack_268 = puStack_3b8;
    puStack_260 = local_3b0;
    local_3d8._24_8_ = (pointer)0x0;
    puStack_3b8 = (pointer)0x0;
    local_3b0 = (pointer)0x0;
    if ((void *)uVar3 != (void *)0x0) {
      operator_delete((void *)uVar3);
    }
    puVar1 = local_250;
    local_258 = local_3a8;
    local_250 = local_3a0;
    puStack_248 = puStack_398;
    puStack_240 = local_390;
    local_3a0 = (pointer)0x0;
    puStack_398 = (pointer)0x0;
    local_390 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_228;
    local_238 = local_388;
    puStack_230 = puStack_380;
    local_228 = local_378;
    puStack_220 = puStack_370;
    puStack_218 = local_368;
    local_378 = (pointer)0x0;
    puStack_370 = (pointer)0x0;
    local_368 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_210;
    local_210 = local_360;
    puStack_208 = puStack_358;
    puStack_200 = local_350;
    local_360 = (pointer)0x0;
    puStack_358 = (pointer)0x0;
    local_350 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1f0;
    local_1f8 = local_348;
    uStack_1f7 = uStack_347;
    NStack_1f4 = NStack_344;
    local_1f0 = local_340;
    puStack_1e8 = puStack_338;
    puStack_1e0 = local_330;
    local_340 = (pointer)0x0;
    puStack_338 = (pointer)0x0;
    local_330 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1d8;
    local_1d8 = local_328;
    puStack_1d0 = puStack_320;
    puStack_1c8 = local_318;
    local_328 = (pointer)0x0;
    puStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1b0;
    local_1c0 = local_310;
    uStack_1bc = uStack_30c;
    uStack_1b8 = uStack_308;
    uStack_1b7 = uStack_307;
    uStack_1b4 = uStack_304;
    local_1b0 = local_300;
    puStack_1a8 = puStack_2f8;
    puStack_1a0 = local_2f0;
    local_300 = (pointer)0x0;
    puStack_2f8 = (pointer)0x0;
    local_2f0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_198;
    local_198 = local_2e8;
    puStack_190 = puStack_2e0;
    puStack_188 = local_2d8;
    local_2e8 = (pointer)0x0;
    puStack_2e0 = (pointer)0x0;
    local_2d8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_180;
    local_180 = local_2d0;
    puStack_178 = puStack_2c8;
    puStack_170 = local_2c0;
    local_2d0 = (pointer)0x0;
    puStack_2c8 = (pointer)0x0;
    local_2c0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar4 = local_168;
    local_168 = local_2b8;
    puStack_160 = puStack_2b0;
    puStack_158 = local_2a8;
    local_2b8 = (pointer)0x0;
    puStack_2b0 = (pointer)0x0;
    local_2a8 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar1 = local_150;
    local_150 = local_2a0;
    puStack_148 = puStack_298;
    puStack_140 = local_290;
    local_2a0 = (pointer)0x0;
    puStack_298 = (pointer)0x0;
    local_290 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    cfd::core::KeyData::~KeyData((KeyData *)local_3d8);
    if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if (local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  else {
    cfd::core::KeyData::KeyData((KeyData *)local_3d8,&local_d8,-1,false);
    uVar3 = local_288._0_8_;
    local_288._0_8_ = local_3d8._0_8_;
    local_288._8_8_ = local_3d8._8_8_;
    local_288._16_8_ = local_3d8._16_8_;
    local_3d8._0_8_ = (pointer)0x0;
    local_3d8._8_8_ = (pointer)0x0;
    local_3d8._16_8_ = (pointer)0x0;
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3);
    }
    uVar3 = local_288._24_8_;
    local_288._24_8_ = local_3d8._24_8_;
    puStack_268 = puStack_3b8;
    puStack_260 = local_3b0;
    local_3d8._24_8_ = (pointer)0x0;
    puStack_3b8 = (pointer)0x0;
    local_3b0 = (pointer)0x0;
    if ((void *)uVar3 != (void *)0x0) {
      operator_delete((void *)uVar3);
    }
    puVar1 = local_250;
    local_258 = local_3a8;
    local_250 = local_3a0;
    puStack_248 = puStack_398;
    puStack_240 = local_390;
    local_3a0 = (pointer)0x0;
    puStack_398 = (pointer)0x0;
    local_390 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_228;
    local_238 = local_388;
    puStack_230 = puStack_380;
    local_228 = local_378;
    puStack_220 = puStack_370;
    puStack_218 = local_368;
    local_378 = (pointer)0x0;
    puStack_370 = (pointer)0x0;
    local_368 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_210;
    local_210 = local_360;
    puStack_208 = puStack_358;
    puStack_200 = local_350;
    local_360 = (pointer)0x0;
    puStack_358 = (pointer)0x0;
    local_350 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1f0;
    local_1f8 = local_348;
    uStack_1f7 = uStack_347;
    NStack_1f4 = NStack_344;
    local_1f0 = local_340;
    puStack_1e8 = puStack_338;
    puStack_1e0 = local_330;
    local_340 = (pointer)0x0;
    puStack_338 = (pointer)0x0;
    local_330 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1d8;
    local_1d8 = local_328;
    puStack_1d0 = puStack_320;
    puStack_1c8 = local_318;
    local_328 = (pointer)0x0;
    puStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1b0;
    local_1c0 = local_310;
    uStack_1bc = uStack_30c;
    uStack_1b8 = uStack_308;
    uStack_1b7 = uStack_307;
    uStack_1b4 = uStack_304;
    local_1b0 = local_300;
    puStack_1a8 = puStack_2f8;
    puStack_1a0 = local_2f0;
    local_300 = (pointer)0x0;
    puStack_2f8 = (pointer)0x0;
    local_2f0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_198;
    local_198 = local_2e8;
    puStack_190 = puStack_2e0;
    puStack_188 = local_2d8;
    local_2e8 = (pointer)0x0;
    puStack_2e0 = (pointer)0x0;
    local_2d8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_180;
    local_180 = local_2d0;
    puStack_178 = puStack_2c8;
    puStack_170 = local_2c0;
    local_2d0 = (pointer)0x0;
    puStack_2c8 = (pointer)0x0;
    local_2c0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar4 = local_168;
    local_168 = local_2b8;
    puStack_160 = puStack_2b0;
    puStack_158 = local_2a8;
    local_2b8 = (pointer)0x0;
    puStack_2b0 = (pointer)0x0;
    local_2a8 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar1 = local_150;
    local_150 = local_2a0;
    puStack_148 = puStack_298;
    puStack_140 = local_290;
    local_2a0 = (pointer)0x0;
    puStack_298 = (pointer)0x0;
    local_290 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    cfd::core::KeyData::~KeyData((KeyData *)local_3d8);
    bVar5 = cfd::core::KeyData::HasExtPubkey((KeyData *)local_288);
    if ((!bVar5) || (bVar5 = cfd::core::KeyData::HasExtPrivkey((KeyData *)local_288), bVar5)) {
      local_3d8._0_8_ = "cfdcapi_psbt.cpp";
      local_3d8._8_4_ = 0x84f;
      local_3d8._16_8_ = "CfdAddPsbtGlobalXpubkey";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_3d8,kCfdLogLevelWarning,"psbt invalid xpubkey format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_3d8._0_8_ = local_3d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Failed to parameter. psbt invalid xpubkey format.","");
      cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_3d8);
      __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
  }
  cfd::core::KeyData::GetExtPubkey((ExtPubkey *)local_3d8,(KeyData *)local_288);
  NVar6 = cfd::core::ExtPubkey::GetNetworkType((ExtPubkey *)local_3d8);
  if (puStack_380 != (pointer)0x0) {
    operator_delete(puStack_380);
  }
  if (puStack_398 != (pointer)0x0) {
    operator_delete(puStack_398);
  }
  if (local_3b0 != (pointer)0x0) {
    operator_delete(local_3b0);
  }
  if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if ((*(int *)((long)psbt_handle + 0x10) != 0) == (NVar6 == kMainnet)) {
    local_3d8._0_8_ = "cfdcapi_psbt.cpp";
    local_3d8._8_4_ = 0x85a;
    local_3d8._16_8_ = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_3d8,kCfdLogLevelWarning,"unmatch xpubkey network type.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"Failed to parameter. unmatch xpubkey network type.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_3d8);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::KeyData::GetBip32Path_abi_cxx11_
            ((string *)local_3d8,(KeyData *)local_288,kApostrophe,false);
  if ((pointer)local_3d8._8_8_ == (pointer)0x0) {
    bVar5 = true;
  }
  else {
    cfd::core::KeyData::GetFingerprint(&local_130,(KeyData *)local_288);
    sVar7 = cfd::core::ByteData::GetDataSize(&local_130);
    bVar5 = sVar7 != 4;
    if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  puVar1 = local_3d8 + 0x10;
  if ((pointer)local_3d8._0_8_ != puVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (bVar5) {
    bVar5 = cfd::capi::IsEmptyString(fingerprint);
    if (bVar5) {
      local_3d8._0_8_ = "cfdcapi_psbt.cpp";
      local_3d8._8_4_ = 0x863;
      local_3d8._16_8_ = "CfdAddPsbtGlobalXpubkey";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_3d8,kCfdLogLevelWarning,"fingerprint is null or empty.")
      ;
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_3d8._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Failed to parameter. fingerprint is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_3d8);
      __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    bVar5 = cfd::capi::IsEmptyString(bip32_path);
    if (bVar5) {
      local_3d8._0_8_ = "cfdcapi_psbt.cpp";
      local_3d8._8_4_ = 0x869;
      local_3d8._16_8_ = "CfdAddPsbtGlobalXpubkey";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_3d8,kCfdLogLevelWarning,"bip32_path is null or empty.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_3d8._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Failed to parameter. bip32_path is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_3d8);
      __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::KeyData::GetExtPubkey(&local_a0,(KeyData *)local_288);
    std::__cxx11::string::string((string *)&local_118,bip32_path,&local_3d9);
    std::__cxx11::string::string((string *)&local_f8,fingerprint,&local_3da);
    cfd::core::ByteData::ByteData(&local_b8,&local_f8);
    cfd::core::KeyData::KeyData((KeyData *)local_3d8,&local_a0,&local_118,&local_b8);
    uVar3 = local_288._0_8_;
    local_288._0_8_ = local_3d8._0_8_;
    local_288._8_8_ = local_3d8._8_8_;
    local_288._16_8_ = local_3d8._16_8_;
    local_3d8._0_8_ = (pointer)0x0;
    local_3d8._8_8_ = (pointer)0x0;
    local_3d8._16_8_ = (pointer)0x0;
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3);
    }
    uVar3 = local_288._24_8_;
    local_288._24_8_ = local_3d8._24_8_;
    puStack_268 = puStack_3b8;
    puStack_260 = local_3b0;
    local_3d8._24_8_ = (pointer)0x0;
    puStack_3b8 = (pointer)0x0;
    local_3b0 = (pointer)0x0;
    if ((void *)uVar3 != (void *)0x0) {
      operator_delete((void *)uVar3);
    }
    puVar1 = local_250;
    local_258 = local_3a8;
    local_250 = local_3a0;
    puStack_248 = puStack_398;
    puStack_240 = local_390;
    local_3a0 = (pointer)0x0;
    puStack_398 = (pointer)0x0;
    local_390 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_228;
    local_238 = local_388;
    puStack_230 = puStack_380;
    local_228 = local_378;
    puStack_220 = puStack_370;
    puStack_218 = local_368;
    local_378 = (pointer)0x0;
    puStack_370 = (pointer)0x0;
    local_368 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_210;
    local_210 = local_360;
    puStack_208 = puStack_358;
    puStack_200 = local_350;
    local_360 = (pointer)0x0;
    puStack_358 = (pointer)0x0;
    local_350 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1f0;
    local_1f8 = local_348;
    uStack_1f7 = uStack_347;
    NStack_1f4 = NStack_344;
    local_1f0 = local_340;
    puStack_1e8 = puStack_338;
    puStack_1e0 = local_330;
    local_340 = (pointer)0x0;
    puStack_338 = (pointer)0x0;
    local_330 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1d8;
    local_1d8 = local_328;
    puStack_1d0 = puStack_320;
    puStack_1c8 = local_318;
    local_328 = (pointer)0x0;
    puStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_1b0;
    local_1c0 = local_310;
    uStack_1bc = uStack_30c;
    uStack_1b8 = uStack_308;
    uStack_1b7 = uStack_307;
    uStack_1b4 = uStack_304;
    local_1b0 = local_300;
    puStack_1a8 = puStack_2f8;
    puStack_1a0 = local_2f0;
    local_300 = (pointer)0x0;
    puStack_2f8 = (pointer)0x0;
    local_2f0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_198;
    local_198 = local_2e8;
    puStack_190 = puStack_2e0;
    puStack_188 = local_2d8;
    local_2e8 = (pointer)0x0;
    puStack_2e0 = (pointer)0x0;
    local_2d8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_180;
    local_180 = local_2d0;
    puStack_178 = puStack_2c8;
    puStack_170 = local_2c0;
    local_2d0 = (pointer)0x0;
    puStack_2c8 = (pointer)0x0;
    local_2c0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar4 = local_168;
    local_168 = local_2b8;
    puStack_160 = puStack_2b0;
    puStack_158 = local_2a8;
    local_2b8 = (pointer)0x0;
    puStack_2b0 = (pointer)0x0;
    local_2a8 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar1 = local_150;
    local_150 = local_2a0;
    puStack_148 = puStack_298;
    puStack_140 = local_290;
    local_2a0 = (pointer)0x0;
    puStack_298 = (pointer)0x0;
    local_290 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    cfd::core::KeyData::~KeyData((KeyData *)local_3d8);
    if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if (local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  cfd::core::Psbt::SetGlobalXpubkey(*(Psbt **)((long)psbt_handle + 0x18),(KeyData *)local_288);
  cfd::core::KeyData::~KeyData((KeyData *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdAddPsbtGlobalXpubkey(
    void* handle, void* psbt_handle, const char* xpubkey,
    const char* fingerprint, const char* bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(xpubkey)) {
      warn(CFD_LOG_SOURCE, "xpubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. xpubkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string xpub_str(xpubkey);
    KeyData key_data;
    if (xpub_str.length() == kCfdExtPubkeyHexSize) {
      key_data = KeyData(ExtPubkey(ByteData(xpub_str)), "", ByteData());
    } else {
      key_data = KeyData(xpub_str);
      if ((!key_data.HasExtPubkey()) || key_data.HasExtPrivkey()) {
        warn(CFD_LOG_SOURCE, "psbt invalid xpubkey format.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. psbt invalid xpubkey format.");
      }
    }

    bool has_mainnet =
        (key_data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);
    if (((psbt_obj->net_type == NetType::kMainnet) && (!has_mainnet)) ||
        ((psbt_obj->net_type != NetType::kMainnet) && (has_mainnet))) {
      warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. unmatch xpubkey network type.");
    }

    if (key_data.GetBip32Path().empty() ||
        (key_data.GetFingerprint().GetDataSize() != 4)) {
      if (IsEmptyString(fingerprint)) {
        warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. fingerprint is null or empty.");
      }
      if (IsEmptyString(bip32_path)) {
        warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. bip32_path is null or empty.");
      }
      key_data = KeyData(
          key_data.GetExtPubkey(), std::string(bip32_path),
          ByteData(fingerprint));
    }
    psbt_obj->psbt->SetGlobalXpubkey(key_data);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}